

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O2

void satoko_write_dimacs(satoko_t *s,char *fname,int wrt_lrnt,int zero_var)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  FILE *__stream;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  char *__format;
  clause_conflict *pcVar8;
  uint uVar9;
  
  if (1 < (uint)wrt_lrnt) {
    __assert_fail("wrt_lrnt == 0 || wrt_lrnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x250,"void satoko_write_dimacs(satoko_t *, char *, int, int)");
  }
  if (1 < (uint)zero_var) {
    __assert_fail("zero_var == 0 || zero_var == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x251,"void satoko_write_dimacs(satoko_t *, char *, int, int)");
  }
  uVar9 = s->activity->size;
  uVar6 = s->trail->size;
  uVar1 = s->originals->size;
  uVar3 = s->learnts->size;
  uVar4 = (ulong)uVar3;
  __stream = _stdout;
  if (fname != (char *)0x0) {
    __stream = fopen(fname,"w");
  }
  if (__stream == (FILE *)0x0) {
    puts("Error: Cannot open output file.");
    return;
  }
  if (wrt_lrnt == 0) {
    uVar3 = 0;
  }
  fprintf(__stream,"p cnf %d %d\n",(ulong)uVar9,(ulong)(uVar6 + uVar1 + uVar3));
  uVar9 = 0xffffffff;
  for (uVar6 = 0; uVar6 < s->assigns->size; uVar6 = uVar6 + 1) {
    cVar2 = var_value(s,uVar6);
    if (cVar2 != '\x03') {
      cVar2 = var_value(s,uVar6);
      if (zero_var == 0) {
        uVar1 = uVar9;
        if (cVar2 != '\x01') {
          uVar1 = uVar6 + 1;
        }
        __format = "%d 0\n";
      }
      else {
        uVar1 = uVar6;
        if (cVar2 == '\x01') {
          uVar1 = uVar9 + 1;
        }
        __format = "%d\n";
      }
      fprintf(__stream,__format,(ulong)uVar1);
    }
    uVar9 = uVar9 - 1;
  }
  puVar5 = vec_uint_data(s->originals);
  for (uVar7 = 0; uVar7 < s->originals->size; uVar7 = uVar7 + 1) {
    if ((ulong)puVar5[uVar7] == 0xffffffff) {
      pcVar8 = (clause_conflict *)0x0;
    }
    else {
      pcVar8 = (clause_conflict *)(s->all_clauses->data + puVar5[uVar7]);
    }
    clause_dump((FILE *)__stream,pcVar8,zero_var ^ 1U);
  }
  if (wrt_lrnt != 0) {
    puVar5 = vec_uint_data(s->learnts);
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      if ((ulong)puVar5[uVar7] == 0xffffffff) {
        pcVar8 = (clause_conflict *)0x0;
      }
      else {
        pcVar8 = (clause_conflict *)(s->all_clauses->data + puVar5[uVar7]);
      }
      clause_dump((FILE *)__stream,pcVar8,zero_var ^ 1U);
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void satoko_write_dimacs(satoko_t *s, char *fname, int wrt_lrnt, int zero_var)
{
    FILE *file;
    unsigned i;
    unsigned n_vars = vec_act_size(s->activity);
    unsigned n_orig = vec_uint_size(s->originals) + vec_uint_size(s->trail);
    unsigned n_lrnts = vec_uint_size(s->learnts);
    unsigned *array;

    assert(wrt_lrnt == 0 || wrt_lrnt == 1);
    assert(zero_var == 0 || zero_var == 1);
    if (fname != NULL)
        file = fopen(fname, "w");
    else
        file = stdout;
    
    if (file == NULL) {
        printf( "Error: Cannot open output file.\n");
        return;
    }
    fprintf(file, "p cnf %d %d\n", n_vars, wrt_lrnt ? n_orig + n_lrnts : n_orig);
    for (i = 0; i < vec_char_size(s->assigns); i++) {
        if ( var_value(s, i) != SATOKO_VAR_UNASSING ) {
            if (zero_var)
                fprintf(file, "%d\n", var_value(s, i) == SATOKO_LIT_FALSE ? -(int)(i) : i);
            else
                fprintf(file, "%d 0\n", var_value(s, i) == SATOKO_LIT_FALSE ? -(int)(i + 1) : i + 1);
        }
    }
    array = vec_uint_data(s->originals);
    for (i = 0; i < vec_uint_size(s->originals); i++)
        clause_dump(file, clause_fetch(s, array[i]), !zero_var);
    
    if (wrt_lrnt) {
        array = vec_uint_data(s->learnts);
        for (i = 0; i < n_lrnts; i++)
            clause_dump(file, clause_fetch(s, array[i]), !zero_var);
    }
    fclose(file);

}